

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall
amrex::BaseFab<char>::setVal<(amrex::RunOn)1>
          (BaseFab<char> *this,char *x,Box *bx,DestComp dcomp,NumComps ncomp)

{
  undefined1 *in_RSI;
  long in_RDI;
  Array4<char> *a;
  undefined1 local_1b8 [56];
  anon_class_72_3_b144924a *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar1;
  Array4<char> local_168;
  Array4<char> *local_128;
  undefined1 *local_118;
  undefined1 *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  char *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_a8 = *(char **)(in_RDI + 0x10);
  local_b0 = (undefined8 *)(in_RDI + 0x18);
  local_b4 = *(int *)(in_RDI + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(in_RDI + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(in_RDI + 0x20);
  local_8 = (int *)(in_RDI + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = in_RDI + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(in_RDI + 0x28) + 1;
  local_28 = in_RDI + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(in_RDI + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_118 = in_RSI;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<char>::Array4(&local_168,local_a8,&local_c0,&local_dc,local_b4);
  local_128 = &local_168;
  uVar1 = 1;
  local_f8 = &stack0xfffffffffffffe94;
  memcpy(local_1b8,local_128,0x3c);
  LoopConcurrentOnCpu<amrex::BaseFab<char>::setVal<(amrex::RunOn)1>(char_const&,amrex::Box_const&,amrex::DestComp,amrex::NumComps)::_lambda(int,int,int,int)_1_>
            ((Box *)CONCAT44(uVar1,in_stack_fffffffffffffe90),
             CONCAT31((int3)((uint)in_stack_fffffffffffffe8c >> 8),*local_118),
             in_stack_fffffffffffffe80);
  return;
}

Assistant:

void
BaseFab<T>::setVal (T const& x, Box const& bx, DestComp dcomp, NumComps ncomp) noexcept
{
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i + ncomp.n <= this->nvar);
    Array4<T> const& a = this->array();
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG (run_on, bx, ncomp.n, i, j, k, n,
    {
        a(i,j,k,n+dcomp.i) = x;
    });
}